

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_base.cpp
# Opt level: O2

ConverterBase * __thiscall Gray16::ConverterBase::convert(ConverterBase *this,QImage *originalImage)

{
  int iVar1;
  QDebug *pQVar2;
  QImage *in_RDX;
  QDebug local_50;
  QDebug local_48;
  QDebug local_40;
  undefined4 local_38;
  undefined8 local_34;
  undefined8 uStack_2c;
  undefined4 local_24;
  char *local_20;
  
  iVar1 = QImage::format();
  if (iVar1 == 0x1c) {
    (**(code **)(*(long *)originalImage + 0x18))(this,originalImage);
  }
  else {
    local_38 = 2;
    local_24 = 0;
    local_34 = 0;
    uStack_2c = 0;
    local_20 = "default";
    QMessageLogger::critical();
    pQVar2 = QDebug::operator<<(&local_48,"Source image not Format_grayscale16:");
    local_50.stream = pQVar2->stream;
    *(int *)(local_50.stream + 0x28) = *(int *)(local_50.stream + 0x28) + 1;
    QImage::format();
    operator<<(&local_40,(Format)&local_50);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug(&local_50);
    QDebug::~QDebug(&local_48);
    QImage::QImage((QImage *)this,in_RDX);
  }
  return this;
}

Assistant:

QImage ConverterBase::convert(const QImage &originalImage) const {
  if(originalImage.format() != QImage::Format_Grayscale16) {
    qCritical() << "Source image not Format_grayscale16:" << originalImage.format();

    return originalImage;
  }

  return mConvert(originalImage);
}